

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtable_test.cpp
# Opt level: O2

int main(void)

{
  code *pcVar1;
  _func_void *p_Var2;
  ostream *poVar3;
  void *pvVar4;
  undefined8 uVar5;
  ssize_t sVar6;
  printable_vtable *__a;
  void *extraout_RDX;
  void *extraout_RDX_00;
  printable_vtable *printable;
  long lVar7;
  _func_void *p_Var8;
  copy_on_write<printable_vtable> *this;
  vector<printable_vtable,_std::allocator<printable_vtable>_> *__range1;
  initializer_list<printable_vtable> __l;
  initializer_list<copy_on_write<printable_vtable>_> __l_00;
  printable_vtable ap_1;
  printable_vtable ap_7;
  printable_vtable pStack_1a1c0;
  printable_vtable pStack_1a198;
  printable_vtable ap;
  printable_vtable apStack_1a140 [204];
  large_printable lStack_18150;
  large_printable lStack_16138;
  large_printable lStack_14120;
  large_printable lStack_12108;
  large_printable lStack_100f0;
  large_printable local_e0d8;
  large_printable local_c0c0;
  large_printable local_a0a8;
  large_printable local_8090;
  large_printable local_6078;
  large_printable local_4060;
  large_printable local_2048;
  printable_vtable *ppVar9;
  
  allocations()::allocations_ = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"sizeof(printable_vtable) = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"hi_printable hi; printable_vtable ap(hi)");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  hi_printable::print((hi_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"large_printable large; printable_vtable ap(large)"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_6078.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::printable_vtable<large_printable>(&ap_1,&local_6078);
  free(local_6078.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,"bye_printable bye; printable_vtable ap(bye)");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  bye_printable::print((bye_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"hi_printable hi; printable_vtable ap = hi");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  hi_printable::print((hi_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap = large");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_8090.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::printable_vtable<large_printable>(&ap_1,&local_8090);
  free(local_8090.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,"bye_printable bye; printable_vtable ap = bye");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  bye_printable::print((bye_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "hi_printable hi; printable_vtable tmp = hi; printable_vtable ap = tmp");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::printable_vtable(&ap_1,&ap);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable tmp = large; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_a0a8.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::printable_vtable<large_printable>(&ap_1,&local_a0a8);
  free(local_a0a8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  printable_vtable::printable_vtable(&ap_7,&ap_1);
  p_Var2 = ap_7.vtable_._M_elems[2];
  pvVar4 = (*ap_7.get_value_ptr_)(&ap_7);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_7);
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "bye_printable bye; printable_vtable tmp = bye; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::printable_vtable(&ap_1,&ap);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"hi_printable hi; printable_vtable ap; ap = hi");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::operator=(&ap);
  p_Var2 = ap.vtable_._M_elems[2];
  pvVar4 = (*ap.get_value_ptr_)(&ap);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap; ap = large");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  ap_1.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap_1.value_ = (void *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c0c0.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::operator=(&ap_1,&local_c0c0);
  free(local_c0c0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,"bye_printable bye; printable_vtable ap; ap = bye")
  ;
  std::operator<<(poVar3,";\nap.print() = ");
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::operator=(&ap);
  p_Var2 = ap.vtable_._M_elems[2];
  pvVar4 = (*ap.get_value_ptr_)(&ap);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap(hi)")
  ;
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  hi_printable::print((hi_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable ap(large)");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_e0d8.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::printable_vtable<large_printable>(&ap_1,&local_e0d8);
  free(local_e0d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable ap(bye)");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  bye_printable::print((bye_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap = hi"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  hi_printable::print((hi_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable ap = large");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  std::vector<double,_std::allocator<double>_>::vector
            (&lStack_100f0.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::printable_vtable<large_printable>(&ap_1,&lStack_100f0);
  free(lStack_100f0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable ap = bye");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  bye_printable::print((bye_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const hi_printable hi{}; printable_vtable tmp = hi; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::printable_vtable(&ap_1,&ap);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable tmp = large; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  std::vector<double,_std::allocator<double>_>::vector
            (&lStack_12108.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::printable_vtable<large_printable>(&ap_1,&lStack_12108);
  free(lStack_12108.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  printable_vtable::printable_vtable(&ap_7,&ap_1);
  pvVar4 = (*ap_7.get_value_ptr_)(&ap_7);
  (*ap_7.vtable_._M_elems[2])(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_7);
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable tmp = bye; printable_vtable ap = tmp"
                          );
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::printable_vtable(&ap_1,&ap);
  p_Var2 = ap_1.vtable_._M_elems[2];
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const hi_printable hi{}; printable_vtable ap; ap = hi");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::operator=(&ap);
  p_Var2 = ap.vtable_._M_elems[2];
  pvVar4 = (*ap.get_value_ptr_)(&ap);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const large_printable large{}; printable_vtable ap; ap = large");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  ap_1.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap_1.value_ = (void *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&lStack_14120.data_,(vector<double,_std::allocator<double>_> *)&ap);
  printable_vtable::operator=(&ap_1,&lStack_14120);
  free(lStack_14120.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  pvVar4 = (*ap_1.get_value_ptr_)(&ap_1);
  (*ap_1.vtable_._M_elems[2])(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "const bye_printable bye{}; printable_vtable ap; ap = bye");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  printable_vtable::operator=(&ap);
  p_Var2 = ap.vtable_._M_elems[2];
  pvVar4 = (*ap.get_value_ptr_)(&ap);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"printable_vtable ap(hi_printable{})");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  hi_printable::print((hi_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"printable_vtable ap(large_printable{})");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable(&local_2048);
  printable_vtable::printable_vtable<large_printable>(&ap,&local_2048);
  free(local_2048.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap.vtable_._M_elems[2];
  pvVar4 = (*ap.get_value_ptr_)(&ap);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"printable_vtable ap(bye_printable{})");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  bye_printable::print((bye_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"printable_vtable ap = hi_printable{}");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  hi_printable::print((hi_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"printable_vtable ap = large_printable{}");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable(&local_4060);
  printable_vtable::printable_vtable<large_printable>(&ap,&local_4060);
  free(local_4060.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap.vtable_._M_elems[2];
  pvVar4 = (*ap.get_value_ptr_)(&ap);
  (*p_Var2)(pvVar4);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"printable_vtable ap = bye_printable{}");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  bye_printable::print((bye_printable *)&ap.value_);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "hi_printable hi; printable_vtable ap(std::ref(hi))");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<hi_printable>_>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<std::reference_wrapper<hi_printable>>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<std::reference_wrapper<hi_printable>>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = &ap_1;
  hi_printable::print((hi_printable *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap(std::ref(large))");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  ap_1.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<large_printable>_>::exec;
  ap_1.vtable_._M_elems[0] = printable_vtable::clone_impl<std::reference_wrapper<large_printable>>;
  ap_1.vtable_._M_elems[1] = printable_vtable::delete_impl<std::reference_wrapper<large_printable>>;
  ap_1.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap_1.value_ = (large_printable *)&ap;
  large_printable::print((large_printable *)&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "bye_printable bye; printable_vtable ap(std::ref(bye))");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<bye_printable>_>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<std::reference_wrapper<bye_printable>>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<std::reference_wrapper<bye_printable>>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = &ap_1;
  bye_printable::print((bye_printable *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "hi_printable hi; printable_vtable ap(std::cref(hi))");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<const_hi_printable>_>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<std::reference_wrapper<hi_printable_const>>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<std::reference_wrapper<hi_printable_const>>
  ;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = &ap_1;
  hi_printable::print((hi_printable *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "large_printable large; printable_vtable ap(std::cref(large))");
  std::operator<<(poVar3,";\nap.print() = ");
  large_printable::large_printable((large_printable *)&ap);
  ap_1.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<const_large_printable>_>::exec;
  ap_1.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<large_printable_const>>;
  ap_1.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<large_printable_const>>;
  ap_1.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap_1.value_ = (large_printable *)&ap;
  large_printable::print((large_printable *)&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap_1);
  free(ap.vtable_._M_elems[0]);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "bye_printable bye; printable_vtable ap(std::cref(bye))");
  std::operator<<(poVar3,";\nap.print() = ");
  ap.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<const_bye_printable>_>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<std::reference_wrapper<bye_printable_const>>
  ;
  ap.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<bye_printable_const>>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = &ap_1;
  bye_printable::print((bye_printable *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  printable_vtable::~printable_vtable(&ap);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "copied vector<printable_vtable>{hi_printable, large_printable}");
  std::operator<<(poVar3,"\n");
  ap.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  ap.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  ap.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  ap.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  ap.value_ = (void *)0x0;
  large_printable::large_printable(&lStack_16138);
  printable_vtable::printable_vtable<large_printable>(apStack_1a140,&lStack_16138);
  __l._M_len = 2;
  __l._M_array = &ap;
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&ap_1,__l,
             (allocator_type *)&ap_7);
  lVar7 = 0x28;
  do {
    printable_vtable::~printable_vtable((printable_vtable *)((long)ap.vtable_._M_elems + lVar7));
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x28);
  free(lStack_16138.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  p_Var2 = ap_1.vtable_._M_elems[1];
  for (p_Var8 = ap_1.vtable_._M_elems[0]; p_Var8 != p_Var2; p_Var8 = p_Var8 + 0x28) {
    pcVar1 = *(code **)(p_Var8 + 0x10);
    uVar5 = (**(code **)(p_Var8 + 0x18))(p_Var8);
    (*pcVar1)(uVar5);
  }
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&ap,
             (vector<printable_vtable,_std::allocator<printable_vtable>_> *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::~vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&ap);
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::~vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "copied vector<COW<printable_vtable>>{hi_printable, large_printable}");
  std::operator<<(poVar3,"\n");
  pStack_1a198.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_1a198.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_1a198.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_1a198.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_1a198.value_ = (void *)0x0;
  std::make_shared<printable_vtable,printable_vtable>(&ap);
  large_printable::large_printable(&lStack_18150);
  printable_vtable::printable_vtable<large_printable>(&pStack_1a1c0,&lStack_18150);
  std::make_shared<printable_vtable,printable_vtable>((printable_vtable *)(ap.vtable_._M_elems + 2))
  ;
  ppVar9 = &ap;
  __a = &ap_7;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)ppVar9;
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
          *)&ap_1,__l_00,(allocator_type *)__a);
  lVar7 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)ap.vtable_._M_elems + lVar7));
    lVar7 = lVar7 + -0x10;
  } while (lVar7 != -8);
  printable_vtable::~printable_vtable(&pStack_1a1c0);
  free(lStack_18150.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  printable_vtable::~printable_vtable(&pStack_1a198);
  p_Var2 = ap_1.vtable_._M_elems[1];
  pvVar4 = extraout_RDX;
  for (this = (copy_on_write<printable_vtable> *)ap_1.vtable_._M_elems[0];
      this != (copy_on_write<printable_vtable> *)p_Var2; this = this + 1) {
    sVar6 = copy_on_write<printable_vtable>::read(this,(int)ppVar9,pvVar4,(size_t)__a);
    pcVar1 = *(code **)(sVar6 + 0x10);
    uVar5 = (**(code **)(sVar6 + 0x18))(sVar6);
    (*pcVar1)(uVar5);
    pvVar4 = extraout_RDX_00;
  }
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
          *)&ap,(vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
                 *)&ap_1);
  poVar3 = std::operator<<((ostream *)&std::cout,"allocations: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\n\n");
  allocations()::allocations_ = 0;
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  ~vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
           *)&ap);
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  ~vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
           *)&ap_1);
  return 0;
}

Assistant:

int main ()
{
#if INSTRUMENT_COPIES
    reset_allocations();
#endif

    std::cout << "sizeof(printable_vtable) = " << sizeof(printable_vtable) << "\n";

#define ECHO(expr)                                                      \
    do {                                                                \
        std::cout << #expr << ";\nap.print() = ";                       \
        expr;                                                           \
        ap.print();                                                     \
        std::cout << "allocations: " << allocations() << "\n\n";        \
        reset_allocations();                                            \
    } while (false)

    ECHO(hi_printable hi; printable_vtable ap(hi));
    ECHO(large_printable large; printable_vtable ap(large));
    ECHO(bye_printable bye; printable_vtable ap(bye));

    ECHO(hi_printable hi; printable_vtable ap = hi);
    ECHO(large_printable large; printable_vtable ap = large);
    ECHO(bye_printable bye; printable_vtable ap = bye);

    ECHO(hi_printable hi; printable_vtable tmp = hi; printable_vtable ap = tmp);
    ECHO(large_printable large; printable_vtable tmp = large; printable_vtable ap = tmp);
    ECHO(bye_printable bye; printable_vtable tmp = bye; printable_vtable ap = tmp);

    ECHO(hi_printable hi; printable_vtable ap; ap = hi);
    ECHO(large_printable large; printable_vtable ap; ap = large);
    ECHO(bye_printable bye; printable_vtable ap; ap = bye);

    ECHO(const hi_printable hi{}; printable_vtable ap(hi));
    ECHO(const large_printable large{}; printable_vtable ap(large));
    ECHO(const bye_printable bye{}; printable_vtable ap(bye));

    ECHO(const hi_printable hi{}; printable_vtable ap = hi);
    ECHO(const large_printable large{}; printable_vtable ap = large);
    ECHO(const bye_printable bye{}; printable_vtable ap = bye);

    ECHO(const hi_printable hi{}; printable_vtable tmp = hi; printable_vtable ap = tmp);
    ECHO(const large_printable large{}; printable_vtable tmp = large; printable_vtable ap = tmp);
    ECHO(const bye_printable bye{}; printable_vtable tmp = bye; printable_vtable ap = tmp);

    ECHO(const hi_printable hi{}; printable_vtable ap; ap = hi);
    ECHO(const large_printable large{}; printable_vtable ap; ap = large);
    ECHO(const bye_printable bye{}; printable_vtable ap; ap = bye);

    ECHO(printable_vtable ap(hi_printable{}));
    ECHO(printable_vtable ap(large_printable{}));
    ECHO(printable_vtable ap(bye_printable{}));

    ECHO(printable_vtable ap = hi_printable{});
    ECHO(printable_vtable ap = large_printable{});
    ECHO(printable_vtable ap = bye_printable{});

    ECHO(hi_printable hi; printable_vtable ap(std::ref(hi)));
    ECHO(large_printable large; printable_vtable ap(std::ref(large)));
    ECHO(bye_printable bye; printable_vtable ap(std::ref(bye)));

    ECHO(hi_printable hi; printable_vtable ap(std::cref(hi)));
    ECHO(large_printable large; printable_vtable ap(std::cref(large)));
    ECHO(bye_printable bye; printable_vtable ap(std::cref(bye)));

#undef ECHO

    {
        std::cout << "copied vector<printable_vtable>{hi_printable, large_printable}" << "\n";

        std::vector<printable_vtable> several_printables = {
            hi_printable{},
            large_printable{}
        };

        for (const auto & printable : several_printables) {
            printable.print();
        }

        std::vector<printable_vtable> several_printables_copy = several_printables;

        std::cout << "allocations: " << allocations() << "\n\n";
        reset_allocations();
    }

    {
        std::cout << "copied vector<COW<printable_vtable>>{hi_printable, large_printable}" << "\n";

        std::vector<copy_on_write<printable_vtable>> several_printables = {
            {hi_printable{}},
            {large_printable{}}
        };

        for (const auto & printable : several_printables) {
            printable->print();
        }

        std::vector<copy_on_write<printable_vtable>> several_printables_copy = several_printables;

        std::cout << "allocations: " << allocations() << "\n\n";
        reset_allocations();
    }

    return 0;
}